

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.h
# Opt level: O3

void __thiscall SQFuncState::AddDefaultParam(SQFuncState *this,SQInteger trg)

{
  ulong uVar1;
  longlong *p;
  ulong uVar2;
  SQUnsignedInteger SVar3;
  
  uVar1 = (this->_defaultparams)._allocated;
  p = (this->_defaultparams)._vals;
  uVar2 = (this->_defaultparams)._size;
  if (uVar1 <= uVar2) {
    SVar3 = 4;
    if (uVar2 * 2 != 0) {
      SVar3 = uVar2 * 2;
    }
    p = (longlong *)sq_vm_realloc(p,uVar1 << 3,SVar3 * 8);
    (this->_defaultparams)._vals = p;
    (this->_defaultparams)._allocated = SVar3;
    uVar2 = (this->_defaultparams)._size;
  }
  (this->_defaultparams)._size = uVar2 + 1;
  p[uVar2] = trg;
  return;
}

Assistant:

void AddDefaultParam(SQInteger trg) { _defaultparams.push_back(trg); }